

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O2

void helper_after_test_gradient_accumulation
               (char *func,int nbatch_physical,ggml_opt_loss_type loss_type,int epoch,
               string *subtest,bool subtest_ok,int *ntest,int *npass)

{
  undefined4 in_register_0000000c;
  undefined7 in_register_00000089;
  string options;
  string local_b0;
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,", nbatch_physical=",(allocator<char> *)&local_b0);
  std::__cxx11::to_string(&local_b0,(int)func);
  std::__cxx11::string::append(local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)local_90);
  std::__cxx11::string::append((char *)local_90);
  std::__cxx11::string::append((char *)local_90);
  std::__cxx11::to_string(&local_b0,loss_type);
  std::__cxx11::string::append(local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_70,local_90);
  std::__cxx11::string::string((string *)&local_50,(string *)CONCAT44(in_register_0000000c,epoch));
  helper_after_test("test_gradient_accumulation",false,&local_70,&local_50,SUB81(subtest,0),
                    (int *)CONCAT71(in_register_00000089,subtest_ok),ntest);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

static void helper_after_test_gradient_accumulation(
        const char * func, const int nbatch_physical, const enum ggml_opt_loss_type loss_type, const int epoch,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    std::string options = ", nbatch_physical=";
    options += std::to_string(nbatch_physical);
    options += ", loss_type=";
    options += loss_type == GGML_OPT_LOSS_TYPE_MEAN ? "mean" : "sum";
    options += ", epoch=";
    options += std::to_string(epoch);
    helper_after_test(func, false, options, subtest, subtest_ok, ntest, npass);
}